

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q9.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  undefined1 local_80 [8];
  string str2;
  undefined1 local_50 [8];
  string str1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  get_args_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&str1.field_2 + 8),argc,argv);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&str1.field_2 + 8));
  if (sVar2 == 3) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&str1.field_2 + 8),1);
    std::__cxx11::string::string((string *)local_50,(string *)pvVar3);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&str1.field_2 + 8),2);
    std::__cxx11::string::string((string *)local_80,(string *)pvVar3);
    bVar1 = rotation((string *)local_50,(string *)local_80);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      poVar4 = std::operator<<(poVar4," is a rotation of ");
      poVar4 = std::operator<<(poVar4,(string *)local_80);
      std::operator<<(poVar4,'\n');
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      poVar4 = std::operator<<(poVar4," is not a rotation of ");
      poVar4 = std::operator<<(poVar4,(string *)local_80);
      std::operator<<(poVar4,'\n');
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&str1.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, char** argv){
  auto args {get_args(argc, argv)};

  if (args.size() == 3){
    std::string str1 {args[1]};
    std::string str2 {args[2]};

    if (rotation(str1, str2)){
      std::cout << str1 << " is a rotation of " << str2 << '\n';
    }
    else{
      std::cout << str1 << " is not a rotation of " << str2 << '\n';
    }
  }

  return 0;
}